

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

bool __thiscall capnp::DynamicStruct::Builder::isSetInUnion(Builder *this,Field field)

{
  ulong uVar1;
  bool bVar2;
  Reader RStack_48;
  
  bVar2 = true;
  if ((0x1f < field.proto._reader.dataSize) && (*(short *)((long)field.proto._reader.data + 2) != 0)
     ) {
    Schema::getProto(&RStack_48,(Schema *)this);
    if (RStack_48._reader.dataSize < 0x120) {
      uVar1 = 0;
    }
    else {
      uVar1 = (ulong)*(uint *)((long)RStack_48._reader.data + 0x20);
    }
    bVar2 = (*(ushort *)((long)(this->builder).data + uVar1 * 2) ^
            *(ushort *)((long)field.proto._reader.data + 2)) == 0xffff;
  }
  return bVar2;
}

Assistant:

bool DynamicStruct::Builder::isSetInUnion(StructSchema::Field field) {
  auto proto = field.getProto();
  if (hasDiscriminantValue(proto)) {
    uint16_t discrim = builder.getDataField<uint16_t>(
        assumeDataOffset(schema.getProto().getStruct().getDiscriminantOffset()));
    return discrim == proto.getDiscriminantValue();
  } else {
    return true;
  }
}